

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

uint * __thiscall
spirv_cross::SmallVector<unsigned_int,_8UL>::erase(SmallVector<unsigned_int,_8UL> *this,uint *itr)

{
  size_t sVar1;
  size_t __n;
  
  sVar1 = (this->super_VectorView<unsigned_int>).buffer_size;
  __n = (long)(this->super_VectorView<unsigned_int>).ptr + (sVar1 * 4 - (long)(itr + 1));
  if (__n != 0) {
    memmove(itr,itr + 1,__n);
    sVar1 = (this->super_VectorView<unsigned_int>).buffer_size;
  }
  (this->super_VectorView<unsigned_int>).buffer_size = sVar1 - 1;
  return itr;
}

Assistant:

T *erase(T *itr) SPIRV_CROSS_NOEXCEPT
	{
		std::move(itr + 1, this->end(), itr);
		this->ptr[--this->buffer_size].~T();
		return itr;
	}